

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_test__add(fct_test_t *test,fctchk_t *chk)

{
  fctchk_t *chk_local;
  fct_test_t *test_local;
  
  if (test == (fct_test_t *)0x0) {
    __assert_fail("test != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x40a
                  ,"void fct_test__add(fct_test_t *, fctchk_t *)");
  }
  if (chk != (fctchk_t *)0x0) {
    if (chk->is_pass == 0) {
      fct_nlist__append(&test->failed_chks,chk);
    }
    else {
      fct_nlist__append(&test->passed_chks,chk);
    }
    return;
  }
  __assert_fail("chk != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x40b,
                "void fct_test__add(fct_test_t *, fctchk_t *)");
}

Assistant:

static void
fct_test__add(fct_test_t *test, fctchk_t *chk)
{

    FCT_ASSERT( test != NULL );
    FCT_ASSERT( chk != NULL );

    if ( fctchk__is_pass(chk) )
    {
        fct_nlist__append(&(test->passed_chks), (void*)chk);
    }
    else
    {
        fct_nlist__append(&(test->failed_chks), (void*)chk);
    }
}